

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc-1123_type.h
# Opt level: O2

bool date::rfc1123::validate(parts *dt)

{
  byte bVar1;
  ushort uVar2;
  undefined4 uVar3;
  byte bVar4;
  week_day wVar5;
  ushort uVar6;
  undefined8 uStack_18;
  
  uVar2 = dt->year;
  uStack_18 = (ulong)uVar2;
  if (uVar2 == 0) {
    return false;
  }
  if ((0xf3 < (byte)(dt->month - 0xd)) && (bVar1 = dt->day, bVar1 != 0)) {
    bVar4 = calendar_helper::days_in_month(uVar2,dt->month);
    if (bVar4 < bVar1) {
      return false;
    }
    if (0x17 < dt->hour) {
      return false;
    }
    if (0x3b < dt->minute) {
      return false;
    }
    if (0x3b < dt->second) {
      return false;
    }
    uVar2 = dt->offset_in_minutes;
    uVar6 = -uVar2;
    if (0 < (short)uVar2) {
      uVar6 = uVar2;
    }
    if (uVar6 < 0x1798) {
      if (dt->week_day != '\0') {
        uVar3._0_2_ = dt->year;
        uVar3._2_1_ = dt->month;
        uVar3._3_1_ = dt->day;
        uStack_18 = CONCAT44(uVar3,(undefined4)uStack_18);
        wVar5 = calendar_helper::day_of_week((date *)((long)&uStack_18 + 4));
        if (dt->week_day != wVar5) {
          return false;
        }
      }
      return true;
    }
  }
  return false;
}

Assistant:

static bool validate(const parts& dt)
    {
        if (dt.year == 0)
            return false;
        if (dt.month == 0 || dt.month > 12)
            return false;
        if (dt.day == 0 || dt.day > calendar_helper::days_in_month(dt.year, dt.month))
            return false;
        if (dt.hour > 23)
            return false;
        if (dt.minute > 59)
            return false;
        if (dt.second > 59)
            return false;
        if (std::abs(dt.offset_in_minutes) > 6039)
            return false;
        if (dt.week_day != 0)
        {
            const auto week_day = calendar_helper::day_of_week(calendar_helper::date{ dt.year, dt.month, dt.day });
            if (dt.week_day != week_day)
                return false;
        }
        return true;
    }